

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineOption.cpp
# Opt level: O3

bool __thiscall senjo::EngineOption::SetValue(EngineOption *this,string *value)

{
  int iVar1;
  const_iterator cVar2;
  int64_t intval;
  long local_20;
  
  local_20 = 0;
  switch(this->optType) {
  case Checkbox:
    iVar1 = std::__cxx11::string::compare((char *)value);
    if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)value), iVar1 != 0)) {
      return false;
    }
    break;
  case ComboBox:
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->comboValues)._M_t,value);
    if ((_Rb_tree_header *)cVar2._M_node == &(this->comboValues)._M_t._M_impl.super__Rb_tree_header)
    {
      return false;
    }
    break;
  case Spin:
    iVar1 = __isoc99_sscanf((value->_M_dataplus)._M_p,"%ld",&local_20);
    if (iVar1 != 1) {
      return false;
    }
    if (local_20 < this->minValue) {
      return false;
    }
    if (this->maxValue < local_20) {
      return false;
    }
    break;
  case String:
    break;
  default:
    return false;
  }
  std::__cxx11::string::_M_assign((string *)&this->optValue);
  return true;
}

Assistant:

bool EngineOption::SetValue(const std::string& value) {
  int64_t intval = 0;
  switch (optType) {
  case OptionType::Checkbox:
    if ((value != "true") && (value != "false")) {
      return false;
    }
    break;
  case OptionType::ComboBox:
    if (!comboValues.count(value)) {
      return false;
    }
    break;
  case OptionType::Spin:
    if ((sscanf(value.c_str(), "%" PRId64, &intval) != 1) ||
        (intval < minValue) ||
        (intval > maxValue))
    {
      return false;
    }
    break;
  case OptionType::String:
    break;
  default:
    return false;
  }
  optValue = value;
  return true;
}